

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O2

int testCorrectEncode(double lat,double lon,int treatAsError)

{
  uint uVar1;
  char *pcVar2;
  Mapcodes mapcodes;
  Mapcodes local_294;
  
  uVar1 = encodeLatLonToMapcodes(&local_294,lat,lon,TERRITORY_UNKNOWN,0);
  if ((int)uVar1 < 1) {
    if (treatAsError == 0) {
      pcVar2 = "WARNING";
    }
    else {
      foundError();
      pcVar2 = "ERROR";
    }
    uVar1 = printf("*** %s *** encodeLatLonToMapcodes returns \'%d\' (should be > 0) for lat=%f, lon=%f\n"
                   ,lat,lon,pcVar2,(ulong)uVar1);
  }
  return uVar1;
}

Assistant:

static int testCorrectEncode(double lat, double lon, int treatAsError) {
    Mapcodes mapcodes;
    int nrResults = encodeLatLonToMapcodes(&mapcodes, lat, lon, TERRITORY_UNKNOWN, 0);
    if (nrResults <= 0) {
        if (treatAsError) {
            foundError();
        }
        printf("*** %s *** encodeLatLonToMapcodes returns '%d' (should be > 0) for lat=%f, lon=%f\n",
               treatAsError ? "ERROR" : "WARNING", nrResults, lat, lon);
    }
    return 1;
}